

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O2

void db_drop_test(void)

{
  fdb_status fVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  char *__format;
  long lVar6;
  fdb_doc *rdoc;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_config fconfig;
  fdb_doc *local_480;
  fdb_kvs_handle *local_478;
  fdb_file_handle *local_470;
  fdb_doc *local_468 [3];
  fdb_kvs_config local_450;
  timeval local_438;
  char local_428 [256];
  char local_328 [256];
  char local_228 [256];
  fdb_config local_128;
  
  gettimeofday(&local_438,(__timezone_ptr_t)0x0);
  memleak_start();
  local_480 = (fdb_doc *)0x0;
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  local_128.buffercache_size = 0x1000000;
  local_128.wal_threshold = 0x400;
  local_128.flags = 1;
  local_128.compaction_threshold = '\0';
  fdb_open(&local_470,"./dummy1",&local_128);
  fdb_kvs_open(local_470,&local_478,(char *)0x0,&local_450);
  fVar1 = fdb_set_log_callback(local_478,logCallbackFunc,"db_drop_test");
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x527);
    db_drop_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x527,"void db_drop_test()");
  }
  uVar5 = 0;
  for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 8) {
    sprintf(local_228,"key%d",uVar5);
    sprintf(local_328,"meta%d",uVar5);
    sprintf(local_428,"body%d",uVar5);
    sVar2 = strlen(local_228);
    sVar3 = strlen(local_328);
    sVar4 = strlen(local_428);
    fdb_doc_create((fdb_doc **)((long)local_468 + lVar6),local_228,sVar2,local_328,sVar3,local_428,
                   sVar4);
    fdb_set(local_478,*(fdb_doc **)((long)local_468 + lVar6));
    uVar5 = (ulong)((int)uVar5 + 1);
  }
  fdb_commit(local_470,'\0');
  fdb_kvs_close(local_478);
  fdb_close(local_470);
  system("rm -rf  dummy1 > errorlog.txt");
  fdb_open(&local_470,"./dummy1",&local_128);
  fdb_kvs_open_default(local_470,&local_478,&local_450);
  fVar1 = fdb_set_log_callback(local_478,logCallbackFunc,"db_drop_test");
  if (fVar1 == FDB_RESULT_SUCCESS) {
    sprintf(local_228,"key%d",0);
    sprintf(local_328,"meta%d",0);
    sprintf(local_428,"body%d",0);
    fdb_doc_free(local_468[0]);
    sVar2 = strlen(local_228);
    sVar3 = strlen(local_328);
    sVar4 = strlen(local_428);
    fdb_doc_create(local_468,local_228,sVar2,local_328,sVar3,local_428,sVar4);
    fdb_set(local_478,local_468[0]);
    fdb_commit(local_470,'\0');
    fdb_doc_create(&local_480,local_468[0]->key,local_468[0]->keylen,(void *)0x0,0,(void *)0x0,0);
    fVar1 = fdb_get(local_478,local_480);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x552);
      db_drop_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x552,"void db_drop_test()");
    }
    if (local_480->seqnum != 1) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x554);
      db_drop_test()::__test_pass = '\x01';
      if (local_480->seqnum != 1) {
        __assert_fail("rdoc->seqnum == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x554,"void db_drop_test()");
      }
    }
    fdb_kvs_close(local_478);
    fdb_close(local_470);
    fdb_doc_free(local_480);
    local_480 = (fdb_doc *)0x0;
    for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
      fdb_doc_free(local_468[lVar6]);
    }
    fdb_shutdown();
    memleak_end();
    __format = "%s PASSED\n";
    if (db_drop_test()::__test_pass != '\0') {
      __format = "%s FAILED\n";
    }
    fprintf(_stderr,__format,"Database drop test");
    return;
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
          ,0x541);
  db_drop_test()::__test_pass = 1;
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x541,"void db_drop_test()");
}

Assistant:

void db_drop_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 3;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc *, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous dummy files
    r = system(SHELL_DEL " dummy* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 16777216;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    // open db
    fdb_open(&dbfile, "./dummy1", &fconfig);
    fdb_kvs_open(dbfile, &db, NULL, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "db_drop_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert first two documents
    for (i=0;i<2;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // Remove the database file manually.
    r = system(SHELL_DEL " dummy1 > errorlog.txt");
    (void)r;

    // Open the empty db with the same name.
    fdb_open(&dbfile, "./dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "db_drop_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // now insert a new doc.
    sprintf(keybuf, "key%d", 0);
    sprintf(metabuf, "meta%d", 0);
    sprintf(bodybuf, "body%d", 0);
    fdb_doc_free(doc[0]);
    fdb_doc_create(&doc[0], (void*)keybuf, strlen(keybuf),
        (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
    fdb_set(db, doc[0]);

    // commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // search by key
    fdb_doc_create(&rdoc, doc[0]->key, doc[0]->keylen, NULL, 0, NULL, 0);
    status = fdb_get(db, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // Make sure that a doc seqnum starts with one.
    TEST_CHK(rdoc->seqnum == 1);

    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all documents
    fdb_doc_free(rdoc);
    rdoc = NULL;
    for (i=0;i<2;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("Database drop test");
}